

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode.c
# Opt level: O1

void mmt_decode(mmt_decode_funcs *funcs,void *state)

{
  byte bVar1;
  uchar uVar2;
  uint32_t uVar3;
  uint uVar4;
  byte *pbVar5;
  mmt_dup_syscall *pmVar6;
  mmt_ioctl_post_v2 *pmVar7;
  mmt_ioctl_post_v2 *pmVar8;
  _func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *p_Var9;
  void *pvVar10;
  mmt_open *pmVar11;
  mmt_mmap2 *pmVar12;
  mmt_mremap *pmVar13;
  mmt_mmap *pmVar14;
  mmt_unmap *pmVar15;
  _func_void_mmt_open_ptr_void_ptr *p_Var16;
  mmt_sync *pmVar17;
  char *pcVar18;
  mmt_buf *buf;
  void *pvVar19;
  undefined8 *extraout_RDX;
  int iVar20;
  uint uVar21;
  long lVar22;
  mmt_buf **ppmVar23;
  uint *puVar24;
  uint *puVar25;
  uint uVar26;
  mmt_memory_dump_v2_prefix *d;
  mmt_buf *b;
  mmt_memory_dump args [20];
  mmt_memory_dump_v2_prefix *local_228;
  mmt_buf *local_220;
  mmt_memory_dump local_218 [20];
  
  puVar24 = (uint *)0x0;
  pbVar5 = (byte *)mmt_load_data_with_prefix(1,0,1);
  if (pbVar5 != (byte *)0x0) {
    do {
      bVar1 = *pbVar5;
      puVar25 = puVar24;
      if (bVar1 < 0x53) {
        if (bVar1 < 0x4d) {
          if ((bVar1 != 0x2d) && (bVar1 != 0x3d)) goto switchD_002512d8_caseD_66;
          uVar21 = 1;
          do {
            uVar2 = mmt_buf[(uVar21 + mmt_idx) - 1];
            if (uVar2 == '\n') {
              if (funcs->msg != (_func_void_uint8_t_ptr_uint_void_ptr *)0x0) {
                (*funcs->msg)(mmt_buf + mmt_idx,uVar21 - 1,state);
              }
              mmt_idx = mmt_idx + uVar21;
              break;
            }
            pvVar10 = mmt_load_data_with_prefix(uVar21,0,0);
            uVar21 = uVar21 + 1;
          } while (pvVar10 != (void *)0x0);
          if (uVar2 != '\n') {
            return;
          }
        }
        else {
          if (bVar1 != 0x4d) {
            if (bVar1 != 0x52) goto switchD_002512d8_caseD_66;
            pvVar10 = mmt_load_data_with_prefix(0xb,0,0);
            uVar21 = *(byte *)((long)pvVar10 + 9) + 0xb;
            pmVar11 = (mmt_open *)mmt_load_data_with_prefix(uVar21,0,0);
            mmt_check_eor(uVar21);
            p_Var16 = (_func_void_mmt_open_ptr_void_ptr *)funcs->memread2;
            goto LAB_00251758;
          }
          pmVar12 = (mmt_mmap2 *)mmt_load_data_with_prefix(0x2a,0,0);
          mmt_check_eor(0x2a);
          if (funcs->mmap2 != (_func_void_mmt_mmap2_ptr_void_ptr *)0x0) {
            (*funcs->mmap2)(pmVar12,state);
          }
          mmt_idx = mmt_idx + 0x2a;
        }
        goto LAB_00251772;
      }
      puVar25 = &switchD_002512d8::switchdataD_00274404;
      switch(bVar1) {
      case 100:
        pmVar6 = (mmt_dup_syscall *)mmt_load_data_with_prefix(10,0,0);
        mmt_check_eor(10);
        if (funcs->dup_syscall != (_func_void_mmt_dup_syscall_ptr_void_ptr *)0x0) {
          (*funcs->dup_syscall)(pmVar6,state);
        }
        mmt_idx = mmt_idx + 10;
        break;
      case 0x65:
        pmVar13 = (mmt_mremap *)mmt_load_data_with_prefix(0x3e,0,0);
        mmt_check_eor(0x3e);
        if (funcs->mremap != (_func_void_mmt_mremap_ptr_void_ptr *)0x0) {
          (*funcs->mremap)(pmVar13,state);
        }
        mmt_idx = mmt_idx + 0x3e;
        break;
      case 0x66:
      case 0x67:
      case 0x68:
      case 0x6b:
      case 0x6c:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x76:
switchD_002512d8_caseD_66:
        mmt_decode_cold_1();
        puVar25[0] = 0;
        puVar25[1] = 0;
        *extraout_RDX = 0;
        uVar21 = (uint)pbVar5;
        pcVar18 = (char *)mmt_load_data_with_prefix(1,uVar21,1);
        if ((pcVar18 != (char *)0x0) && (*pcVar18 == 'y')) {
          pvVar10 = mmt_load_data_with_prefix(9,uVar21,0);
          buf = (mmt_buf *)mmt_load_data_with_prefix(4,uVar21 + 9,0);
          mmt_buf_check_sanity(buf);
          uVar3 = buf->len;
          pvVar19 = mmt_load_data_with_prefix(uVar3 + 5,uVar21 + 9,0);
          mmt_check_eor(uVar21 + uVar3 + 0xe);
          *(void **)puVar25 = pvVar10;
          *extraout_RDX = pvVar19;
        }
        return;
      case 0x69:
        do {
          pvVar10 = mmt_load_data_with_prefix(0xe,0,0);
          mmt_buf_check_sanity((mmt_buf *)((long)pvVar10 + 9));
          uVar26 = *(int *)((long)pvVar10 + 9) + 0xe;
          pmVar7 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar26,0,0);
          mmt_check_eor(uVar26);
          ppmVar23 = &local_218[0].data;
          lVar22 = 0;
          uVar21 = uVar26;
          do {
            uVar4 = load_memory_dump_v2(uVar21,&local_228,&local_220);
            if (uVar4 == 0) goto LAB_0025139c;
            ((mmt_memory_dump *)(ppmVar23 + -2))->addr = local_228->addr;
            *ppmVar23 = local_220;
            ppmVar23[-1] = (mmt_buf *)0x0;
            lVar22 = lVar22 + 1;
            uVar21 = uVar21 + uVar4;
            ppmVar23 = ppmVar23 + 3;
          } while (lVar22 != 0x14);
          lVar22 = 0x14;
LAB_0025139c:
          iVar20 = (int)lVar22;
          pmVar8 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar26,0,0);
        } while (pmVar7 != pmVar8);
        p_Var9 = (_func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *)
                 funcs->ioctl_pre;
        goto LAB_00251467;
      case 0x6a:
        do {
          pvVar10 = mmt_load_data_with_prefix(0x1e,0,0);
          mmt_buf_check_sanity((mmt_buf *)((long)pvVar10 + 0x19));
          uVar26 = *(int *)((long)pvVar10 + 0x19) + 0x1e;
          pmVar7 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar26,0,0);
          mmt_check_eor(uVar26);
          ppmVar23 = &local_218[0].data;
          lVar22 = 0;
          uVar21 = uVar26;
          do {
            uVar4 = load_memory_dump_v2(uVar21,&local_228,&local_220);
            if (uVar4 == 0) goto LAB_00251449;
            ((mmt_memory_dump *)(ppmVar23 + -2))->addr = local_228->addr;
            *ppmVar23 = local_220;
            ppmVar23[-1] = (mmt_buf *)0x0;
            lVar22 = lVar22 + 1;
            uVar21 = uVar21 + uVar4;
            ppmVar23 = ppmVar23 + 3;
          } while (lVar22 != 0x14);
          lVar22 = 0x14;
LAB_00251449:
          iVar20 = (int)lVar22;
          pmVar8 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar26,0,0);
        } while (pmVar7 != pmVar8);
        p_Var9 = funcs->ioctl_post;
LAB_00251467:
        if (p_Var9 != (_func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *)0x0) {
          (*p_Var9)(pmVar7,state,local_218,iVar20);
        }
        mmt_idx = mmt_idx + uVar21;
        break;
      case 0x6d:
        pmVar14 = (mmt_mmap *)mmt_load_data_with_prefix(0x1e,0,0);
        mmt_check_eor(0x1e);
        if (funcs->mmap != (_func_void_mmt_mmap_ptr_void_ptr *)0x0) {
          (*funcs->mmap)(pmVar14,state);
        }
        mmt_idx = mmt_idx + 0x1e;
        break;
      case 0x6e:
        mmt_decode_nvidia((mmt_nvidia_decode_funcs *)funcs,state);
        break;
      case 0x6f:
        pvVar10 = mmt_load_data_with_prefix(0x12,0,0);
        mmt_buf_check_sanity((mmt_buf *)((long)pvVar10 + 0xd));
        uVar21 = *(int *)((long)pvVar10 + 0xd) + 0x12;
        pmVar11 = (mmt_open *)mmt_load_data_with_prefix(uVar21,0,0);
        mmt_check_eor(uVar21);
        p_Var16 = funcs->open;
        goto LAB_00251758;
      case 0x72:
        pvVar10 = mmt_load_data_with_prefix(0xb,0,0);
        uVar21 = *(byte *)((long)pvVar10 + 9) + 0xb;
        pmVar11 = (mmt_open *)mmt_load_data_with_prefix(uVar21,0,0);
        mmt_check_eor(uVar21);
        p_Var16 = (_func_void_mmt_open_ptr_void_ptr *)funcs->memread;
        goto LAB_00251758;
      case 0x74:
        pvVar10 = mmt_load_data_with_prefix(10,0,0);
        mmt_buf_check_sanity((mmt_buf *)((long)pvVar10 + 5));
        uVar21 = *(int *)((long)pvVar10 + 5) + 10;
        pmVar11 = (mmt_open *)mmt_load_data_with_prefix(uVar21,0,0);
        mmt_check_eor(uVar21);
        p_Var16 = (_func_void_mmt_open_ptr_void_ptr *)funcs->write_syscall;
        goto LAB_00251758;
      case 0x75:
        pmVar15 = (mmt_unmap *)mmt_load_data_with_prefix(0x2e,0,0);
        mmt_check_eor(0x2e);
        if (funcs->munmap != (_func_void_mmt_unmap_ptr_void_ptr *)0x0) {
          (*funcs->munmap)(pmVar15,state);
        }
        mmt_idx = mmt_idx + 0x2e;
        break;
      case 0x77:
        pvVar10 = mmt_load_data_with_prefix(0xb,0,0);
        uVar21 = *(byte *)((long)pvVar10 + 9) + 0xb;
        pmVar11 = (mmt_open *)mmt_load_data_with_prefix(uVar21,0,0);
        mmt_check_eor(uVar21);
        p_Var16 = (_func_void_mmt_open_ptr_void_ptr *)funcs->memwrite;
LAB_00251758:
        if (p_Var16 != (_func_void_mmt_open_ptr_void_ptr *)0x0) {
          (*p_Var16)(pmVar11,state);
        }
        mmt_idx = mmt_idx + uVar21;
        break;
      default:
        if (bVar1 != 0x53) {
          puVar25 = puVar24;
          if (bVar1 != 0x57) goto switchD_002512d8_caseD_66;
          pvVar10 = mmt_load_data_with_prefix(0xb,0,0);
          uVar21 = *(byte *)((long)pvVar10 + 9) + 0xb;
          pmVar11 = (mmt_open *)mmt_load_data_with_prefix(uVar21,0,0);
          mmt_check_eor(uVar21);
          p_Var16 = (_func_void_mmt_open_ptr_void_ptr *)funcs->memwrite2;
          goto LAB_00251758;
        }
        pmVar17 = (mmt_sync *)mmt_load_data_with_prefix(6,0,0);
        mmt_check_eor(6);
        if (funcs->sync != (_func_void_mmt_sync_ptr_void_ptr *)0x0) {
          (*funcs->sync)(pmVar17,state);
        }
        mmt_idx = mmt_idx + 6;
      }
LAB_00251772:
      puVar24 = (uint *)0x0;
      pbVar5 = (byte *)mmt_load_data_with_prefix(1,0,1);
    } while (pbVar5 != (byte *)0x0);
  }
  return;
}

Assistant:

void mmt_decode(const struct mmt_decode_funcs *funcs, void *state)
{
	unsigned int size;
	while (1)
	{
		struct mmt_message *msg = mmt_load_initial_data();
		if (msg == NULL)
			return;

		if (msg->type == '=' || msg->type == '-')
		{
			unsigned int len = 0;
			while (mmt_buf[mmt_idx + len] != 10)
				if (mmt_load_data(++len) == NULL)
					return;

			if (funcs->msg)
				funcs->msg(&mmt_buf[mmt_idx], len, state);

			mmt_idx += len + 1;
		}
		else if (msg->type == 'r') // read
		{
			struct mmt_read *w;
			size = sizeof(struct mmt_read) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memread)
				funcs->memread(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'R') // read2
		{
			struct mmt_read2 *w;
			size = sizeof(struct mmt_read2) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memread2)
				funcs->memread2(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'w') // write
		{
			struct mmt_write *w;
			size = sizeof(struct mmt_write) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memwrite)
				funcs->memwrite(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'W') // write2
		{
			struct mmt_write2 *w;
			size = sizeof(struct mmt_write2) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memwrite2)
				funcs->memwrite2(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'M') // mmap v2
		{
			size = sizeof(struct mmt_mmap2) + 1;
			struct mmt_mmap2 *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->mmap2)
				funcs->mmap2(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'm') // mmap
		{
			size = sizeof(struct mmt_mmap) + 1;
			struct mmt_mmap *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->mmap)
				funcs->mmap(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'u') // unmap
		{
			size = sizeof(struct mmt_unmap) + 1;
			struct mmt_unmap *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->munmap)
				funcs->munmap(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'e') // mremap
		{
			size = sizeof(struct mmt_mremap) + 1;
			struct mmt_mremap *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->mremap)
				funcs->mremap(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'o') // open
		{
			size = sizeof(struct mmt_open) + 1;
			struct mmt_open *o;
			o = mmt_load_data(size);
			mmt_buf_check_sanity(&o->path);
			size += o->path.len;
			o = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->open)
				funcs->open(o, state);

			mmt_idx += size;
		}
		else if (msg->type == 'n') // nvidia / nouveau
			mmt_decode_nvidia((struct mmt_nvidia_decode_funcs *)funcs, state);
		else if (msg->type == 't') // write syscall
		{
			struct mmt_write_syscall *w;
			size = sizeof(struct mmt_write_syscall) + 1;
			w = mmt_load_data(size);
			mmt_buf_check_sanity(&w->data);
			size += w->data.len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->write_syscall)
				funcs->write_syscall(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'S') // sync
		{
			size = sizeof(struct mmt_sync) + 1;
			struct mmt_sync *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->sync)
				funcs->sync(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'd') // dup syscall
		{
			size = sizeof(struct mmt_dup_syscall) + 1;
			struct mmt_dup_syscall *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->dup_syscall)
				funcs->dup_syscall(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'i') // ioctl pre
		{
#define MAX_ARGS 20
			unsigned int size2, pfx;
			struct mmt_memory_dump args[MAX_ARGS];
			struct mmt_ioctl_pre_v2 *ctl;
			int argc;

			do
			{
				size = sizeof(struct mmt_ioctl_pre_v2) + 1;
				ctl = mmt_load_data(size);
				mmt_buf_check_sanity(&ctl->data);
				size += ctl->data.len;
				ctl = mmt_load_data(size);

				mmt_check_eor(size);

				argc = 0;

				struct mmt_memory_dump_v2_prefix *d;
				struct mmt_buf *b;
				pfx = size;

				while ((size2 = load_memory_dump_v2(pfx, &d, &b)))
				{
					args[argc].addr = d->addr;
					args[argc].data = b;
					args[argc].str = NULL;
					argc++;
					pfx += size2;
					if (argc == MAX_ARGS)
						break;
				}
			}
			while (ctl != mmt_load_data(size));

			if (funcs->ioctl_pre)
				funcs->ioctl_pre(ctl, state, args, argc);

			mmt_idx += pfx;
		}
		else if (msg->type == 'j')
		{
			unsigned int size2, pfx;
			struct mmt_memory_dump args[MAX_ARGS];
			struct mmt_ioctl_post_v2 *ctl;
			int argc;

			do
			{
				size = sizeof(struct mmt_ioctl_post_v2) + 1;
				ctl = mmt_load_data(size);
				mmt_buf_check_sanity(&ctl->data);
				size += ctl->data.len;
				ctl = mmt_load_data(size);

				mmt_check_eor(size);

				argc = 0;

				struct mmt_memory_dump_v2_prefix *d;
				struct mmt_buf *b;
				pfx = size;

				while ((size2 = load_memory_dump_v2(pfx, &d, &b)))
				{
					args[argc].addr = d->addr;
					args[argc].data = b;
					args[argc].str = NULL;
					argc++;
					pfx += size2;
					if (argc == MAX_ARGS)
						break;
				}
			}
			while (ctl != mmt_load_data(size));

			if (funcs->ioctl_post)
				funcs->ioctl_post(ctl, state, args, argc);

			mmt_idx += pfx;
#undef MAX_ARGS
		}
		else
		{
			fflush(stdout);
			fprintf(stderr, "unknown type: 0x%x\n", msg->type);
			fprintf(stderr, "%c\n", msg->type);
			mmt_dump_next();
			exit(1);
		}
	}
}